

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

int use_pick_axe2(obj *obj,schar dx,schar dy,schar dz)

{
  level *plVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  trap *trap_00;
  obj *poVar7;
  char *pcVar8;
  bool bVar9;
  monst *local_168;
  boolean vibrate;
  trap *trap;
  char local_148 [4];
  int dam;
  char buf [256];
  char *verbing;
  boolean ispick;
  int dig_target;
  rm *loc;
  int ry;
  int rx;
  schar dz_local;
  schar dy_local;
  schar dx_local;
  obj *obj_local;
  
  if ((obj->oclass == '\x02') || (bVar9 = false, obj->oclass == '\x06')) {
    bVar9 = objects[obj->otyp].oc_subtyp == '\x04';
  }
  pcVar6 = "chopping";
  if (bVar9) {
    pcVar6 = "digging";
  }
  ry._1_1_ = dz;
  ry._2_1_ = dy;
  ry._3_1_ = dx;
  _rx = obj;
  if (((u._1052_1_ & 1) == 0) || (bVar2 = attack(u.ustuck,dx,dy), bVar2 == '\0')) {
    if (((byte)u._1052_1_ >> 1 & 1) == 0) {
      if (ry._1_1_ < '\0') {
        if (((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
           ((youmonst.data)->mlet != '\x05')) {
          pcVar6 = ceiling((int)u.ux,(int)u.uy);
          pline("You can\'t reach the %s.",pcVar6);
        }
        else {
          pline("You don\'t have enough leverage.");
        }
      }
      else if (((ry._3_1_ == '\0') && (ry._2_1_ == '\0')) && (ry._1_1_ == '\0')) {
        iVar3 = rnd(2);
        iVar4 = dbon();
        trap._4_4_ = iVar3 + iVar4 + (int)_rx->spe;
        if (trap._4_4_ < 1) {
          trap._4_4_ = 1;
        }
        pcVar6 = yname(uwep);
        pline("You hit yourself with %s.",pcVar6);
        sprintf(local_148,"%s own %s",genders[(int)(uint)(flags.female != '\0')].his,
                obj_descr[objects[_rx->otyp].oc_name_idx].oc_name);
        losehp(trap._4_4_,local_148,1);
        iflags.botl = '\x01';
      }
      else if (ry._1_1_ == '\0') {
        if (((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) ||
           (((youmonst.data)->mlet == '\x1c' ||
            ((u.uprops[0x1c].intrinsic != 0 && (iVar3 = rn2(5), iVar3 == 0)))))) {
          confdir((schar *)((long)&ry + 3),(schar *)((long)&ry + 2));
        }
        plVar1 = level;
        iVar3 = (int)u.ux + (int)ry._3_1_;
        iVar4 = (int)u.uy + (int)ry._2_1_;
        if ((((iVar3 < 1) || (0x4f < iVar3)) || (iVar4 < 0)) || (0x14 < iVar4)) {
          pline("Clash!");
        }
        else {
          if ((level->monsters[iVar3][iVar4] != (monst *)0x0) &&
             ((*(uint *)&level->monsters[iVar3][iVar4]->field_0x60 >> 9 & 1) == 0)) {
            if ((level->monsters[iVar3][iVar4] == (monst *)0x0) ||
               ((*(uint *)&level->monsters[iVar3][iVar4]->field_0x60 >> 9 & 1) != 0)) {
              local_168 = (monst *)0x0;
            }
            else {
              local_168 = level->monsters[iVar3][iVar4];
            }
            bVar2 = attack(local_168,ry._3_1_,ry._2_1_);
            if (bVar2 != '\0') {
              return 1;
            }
          }
          iVar5 = dig_typ(_rx,(xchar)iVar3,(xchar)iVar4);
          if (iVar5 == 0) {
            trap_00 = t_at(level,iVar3,iVar4);
            if ((trap_00 == (trap *)0x0) || ((trap_00->field_0x8 & 0x1f) != 0x13)) {
              if (plVar1->locations[iVar3][iVar4].typ == '\x16') {
                pline("Clang!");
                wake_nearby();
              }
              else if ((plVar1->locations[iVar3][iVar4].typ == '\r') ||
                      ((((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
                        (plVar1->locations[iVar3][iVar4].typ == '\0')) ||
                       (plVar1->locations[iVar3][iVar4].typ == '\x0e')))) {
                pline("You need an axe to cut down a tree.");
              }
              else if (plVar1->locations[iVar3][iVar4].typ < '\x11') {
                pline("You need a pick to dig rock.");
              }
              else if ((bVar9) ||
                      ((poVar7 = sobj_at(0x215,level,iVar3,iVar4), poVar7 == (obj *)0x0 &&
                       (poVar7 = sobj_at(0x214,level,iVar3,iVar4), poVar7 == (obj *)0x0)))) {
                pcVar6 = aobjnam(_rx,(char *)0x0);
                pline("You swing your %s through thin air.",pcVar6);
              }
              else {
                iVar5 = rn2(3);
                poVar7 = sobj_at(0x215,level,iVar3,iVar4);
                pcVar6 = "boulder";
                if (poVar7 != (obj *)0x0) {
                  pcVar6 = "statue";
                }
                pcVar8 = "";
                if (iVar5 == 0) {
                  pcVar8 = " The axe-handle vibrates violently!";
                }
                pline("Sparks fly as you whack the %s.%s",pcVar6,pcVar8);
                if (iVar5 == 0) {
                  losehp(2,"axing a hard object",1);
                }
              }
            }
            else {
              if (((byte)trap_00->field_0x8 >> 5 & 1) == 0) {
                seetrap(trap_00);
                pline("There is a spider web there!");
              }
              pcVar6 = aobjnam(_rx,"become");
              pline("Your %s entangled in the web.",pcVar6);
              iVar3 = dice(2,2);
              nomul(-iVar3,"stuck in a spider web");
              nomovemsg = "You pull free.";
            }
          }
          else {
            did_dig_msg = '\0';
            digging.quiet = '\0';
            if (((digging.pos.x == iVar3) && (digging.pos.y == iVar4)) &&
               ((bVar2 = on_level(&digging.level,&u.uz), bVar2 != '\0' && (digging.down == '\0'))))
            {
              pcVar8 = "continue";
              if (digging.chew != '\0') {
                pcVar8 = "begin";
              }
              pline("You %s %s.",pcVar8,use_pick_axe2::d_action[iVar5]);
              digging.chew = '\0';
            }
            else {
              if ((((((flags.autodig != '\0') && (iVar5 == 1)) && (digging.down == '\0')) &&
                   ((digging.pos.x == u.ux && (digging.pos.y == u.uy)))) &&
                  (moves <= digging.lastdigtime + 2U)) && ((uint)digging.lastdigtime <= moves)) {
                did_dig_msg = '\x01';
                digging.quiet = '\x01';
              }
              digging.chew = '\0';
              digging.down = '\0';
              digging.warned = '\0';
              digging.pos.x = (xchar)iVar3;
              digging.pos.y = (xchar)iVar4;
              assign_level(&digging.level,&u.uz);
              digging.effort = 0;
              if (digging.quiet == '\0') {
                pline("You start %s.",use_pick_axe2::d_action[iVar5]);
              }
            }
            set_occupation(dig,pcVar6,0);
          }
        }
      }
      else {
        bVar2 = on_level(&u.uz,&dungeon_topology.d_air_level);
        if ((bVar2 == '\0') &&
           (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) {
          bVar2 = can_reach_floor();
          if (bVar2 == '\0') {
            pcVar6 = surface((int)u.ux,(int)u.uy);
            pline("You can\'t reach the %s.",pcVar6);
          }
          else {
            bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
            if ((bVar2 == '\0') && (bVar2 = is_lava(level,(int)u.ux,(int)u.uy), bVar2 == '\0')) {
              if (bVar9) {
                if ((((digging.pos.x == u.ux) && (digging.pos.y == u.uy)) &&
                    (bVar2 = on_level(&digging.level,&u.uz), bVar2 != '\0')) &&
                   (digging.down != '\0')) {
                  pline("You continue %s downward.",pcVar6);
                }
                else {
                  digging.chew = '\0';
                  digging.down = '\x01';
                  digging.warned = '\0';
                  digging.pos.x = u.ux;
                  digging.pos.y = u.uy;
                  assign_level(&digging.level,&u.uz);
                  digging.effort = 0;
                  pline("You start %s downward.",pcVar6);
                  if (u.ushops[0] != '\0') {
                    shopdig(0);
                  }
                }
                did_dig_msg = '\0';
                set_occupation(dig,pcVar6,0);
              }
              else {
                pcVar6 = aobjnam(_rx,(char *)0x0);
                pcVar8 = surface((int)u.ux,(int)u.uy);
                pline("Your %s merely scratches the %s.",pcVar6,pcVar8);
                u_wipe_engr(3);
              }
            }
            else {
              bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
              pcVar6 = " the lava";
              if (bVar2 != '\0') {
                pcVar6 = "water";
              }
              pline("You cannot stay under%s long enough.",pcVar6);
            }
          }
        }
        else {
          pcVar6 = aobjnam(_rx,(char *)0x0);
          pline("You swing your %s through thin air.",pcVar6);
        }
      }
    }
    else {
      pline("Turbulence torpedoes your %s attempts.",pcVar6);
    }
  }
  return 1;
}

Assistant:

int use_pick_axe2(struct obj *obj, schar dx, schar dy, schar dz)
{
	int rx, ry;
	struct rm *loc;
	int dig_target;
	boolean ispick = is_pick(obj);
	const char *verbing = ispick ? "digging" : "chopping";

	if (u.uswallow && attack(u.ustuck, dx, dy)) {
		;  /* return 1 */
	} else if (Underwater) {
		pline("Turbulence torpedoes your %s attempts.", verbing);
	} else if (dz < 0) {
		if (Levitation)
			pline("You don't have enough leverage.");
		else
			pline("You can't reach the %s.",ceiling(u.ux,u.uy));
	} else if (!dx && !dy && !dz) {
		char buf[BUFSZ];
		int dam;

		dam = rnd(2) + dbon() + obj->spe;
		if (dam <= 0)
		    dam = 1;
		pline("You hit yourself with %s.", yname(uwep));
		sprintf(buf, "%s own %s", uhis(),
				OBJ_NAME(objects[obj->otyp]));
		losehp(dam, buf, KILLED_BY);
		iflags.botl=1;
		return 1;
	} else if (dz == 0) {
		if (Stunned || (Confusion && !rn2(5)))
		    confdir(&dx, &dy);
		rx = u.ux + dx;
		ry = u.uy + dy;
		if (!isok(rx, ry)) {
			pline("Clash!");
			return 1;
		}
		loc = &level->locations[rx][ry];
		if (MON_AT(level, rx, ry) && attack(m_at(level, rx, ry), dx, dy))
			return 1;
		dig_target = dig_typ(obj, rx, ry);
		if (dig_target == DIGTYP_UNDIGGABLE) {
			/* ACCESSIBLE or POOL */
			struct trap *trap = t_at(level, rx, ry);

			if (trap && trap->ttyp == WEB) {
			    if (!trap->tseen) {
				seetrap(trap);
				pline("There is a spider web there!");
			    }
			    pline("Your %s entangled in the web.",
				aobjnam(obj, "become"));
			    /* you ought to be able to let go; tough luck */
			    /* (maybe `move_into_trap()' would be better) */
			    nomul(-dice(2,2), "stuck in a spider web");
			    nomovemsg = "You pull free.";
			} else if (loc->typ == IRONBARS) {
			    pline("Clang!");
			    wake_nearby();
			} else if (IS_TREES(level, loc->typ))
			    pline("You need an axe to cut down a tree.");
			else if (IS_ROCK(loc->typ))
			    pline("You need a pick to dig rock.");
			else if (!ispick && (sobj_at(STATUE, level, rx, ry) ||
					     sobj_at(BOULDER, level, rx, ry))) {
			    boolean vibrate = !rn2(3);
			    pline("Sparks fly as you whack the %s.%s",
				sobj_at(STATUE, level, rx, ry) ? "statue" : "boulder",
				vibrate ? " The axe-handle vibrates violently!" : "");
			    if (vibrate) losehp(2, "axing a hard object", KILLED_BY);
			}
			else
			    pline("You swing your %s through thin air.",
				aobjnam(obj, NULL));
		} else {
			static const char * const d_action[6] = {
						"swinging",
						"digging",
						"chipping the statue",
						"hitting the boulder",
						"chopping at the door",
						"cutting the tree"
			};
			did_dig_msg = FALSE;
			digging.quiet = FALSE;
			if (digging.pos.x != rx || digging.pos.y != ry ||
			    !on_level(&digging.level, &u.uz) || digging.down) {
			    if (flags.autodig &&
				dig_target == DIGTYP_ROCK && !digging.down &&
				digging.pos.x == u.ux &&
				digging.pos.y == u.uy &&
				(moves <= digging.lastdigtime+2 &&
				 moves >= digging.lastdigtime)) {
				/* avoid messages if repeated autodigging */
				did_dig_msg = TRUE;
				digging.quiet = TRUE;
			    }
			    digging.down = digging.chew = FALSE;
			    digging.warned = FALSE;
			    digging.pos.x = rx;
			    digging.pos.y = ry;
			    assign_level(&digging.level, &u.uz);
			    digging.effort = 0;
			    if (!digging.quiet)
				pline("You start %s.", d_action[dig_target]);
			} else {
			    pline("You %s %s.", digging.chew ? "begin" : "continue",
					d_action[dig_target]);
			    digging.chew = FALSE;
			}
			set_occupation(dig, verbing, 0);
		}
	} else if (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz)) {
		/* it must be air -- water checked above */
		pline("You swing your %s through thin air.", aobjnam(obj, NULL));
	} else if (!can_reach_floor()) {
		pline("You can't reach the %s.", surface(u.ux,u.uy));
	} else if (is_pool(level, u.ux, u.uy) || is_lava(level, u.ux, u.uy)) {
		/* Monsters which swim also happen not to be able to dig */
		pline("You cannot stay under%s long enough.",
				is_pool(level, u.ux, u.uy) ? "water" : " the lava");
	} else if (!ispick) {
		pline("Your %s merely scratches the %s.",
				aobjnam(obj, NULL), surface(u.ux,u.uy));
		u_wipe_engr(3);
	} else {
		if (digging.pos.x != u.ux || digging.pos.y != u.uy ||
			!on_level(&digging.level, &u.uz) || !digging.down) {
		    digging.chew = FALSE;
		    digging.down = TRUE;
		    digging.warned = FALSE;
		    digging.pos.x = u.ux;
		    digging.pos.y = u.uy;
		    assign_level(&digging.level, &u.uz);
		    digging.effort = 0;
		    pline("You start %s downward.", verbing);
		    if (*u.ushops) shopdig(0);
		} else
		    pline("You continue %s downward.", verbing);
		did_dig_msg = FALSE;
		set_occupation(dig, verbing, 0);
	}
	return 1;
}